

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_streambuf.hpp
# Opt level: O0

void __thiscall
asio::basic_streambuf<std::allocator<char>_>::reserve
          (basic_streambuf<std::allocator<char>_> *this,size_t n)

{
  long lVar1;
  reference pvVar2;
  reference pvVar3;
  unsigned_long *puVar4;
  char *pcVar5;
  length_error local_48 [8];
  length_error ex;
  unsigned_long local_38;
  unsigned_long local_30;
  size_t pend;
  size_t pnext;
  size_t gnext;
  size_t n_local;
  basic_streambuf<std::allocator<char>_> *this_local;
  
  gnext = n;
  n_local = (size_t)this;
  lVar1 = std::streambuf::gptr();
  pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&this->buffer_,0);
  pnext = lVar1 - (long)pvVar2;
  lVar1 = std::streambuf::pptr();
  pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&this->buffer_,0);
  pend = lVar1 - (long)pvVar2;
  lVar1 = std::streambuf::epptr();
  pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&this->buffer_,0);
  local_30 = lVar1 - (long)pvVar2;
  if (local_30 - pend < gnext) {
    if (pnext != 0) {
      pend = pend - pnext;
      pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&this->buffer_,0);
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&this->buffer_,0);
      memmove(pvVar2,pvVar3 + pnext,pend);
    }
    if (local_30 - pend < gnext) {
      if ((this->max_size_ < gnext) || (this->max_size_ - gnext < pend)) {
        std::length_error::length_error(local_48,"asio::streambuf too long");
        detail::throw_exception<std::length_error>(local_48);
        std::length_error::~length_error(local_48);
      }
      else {
        local_30 = pend + gnext;
        local_38 = 1;
        puVar4 = std::max<unsigned_long>(&local_30,&local_38);
        std::vector<char,_std::allocator<char>_>::resize(&this->buffer_,*puVar4);
      }
    }
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&this->buffer_,0);
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&this->buffer_,0);
    std::vector<char,_std::allocator<char>_>::operator[](&this->buffer_,0);
    std::streambuf::setg((char *)this,pvVar2,pvVar3);
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&this->buffer_,0);
    pcVar5 = pvVar2 + pend;
    std::vector<char,_std::allocator<char>_>::operator[](&this->buffer_,0);
    std::streambuf::setp((char *)this,pcVar5);
  }
  return;
}

Assistant:

void reserve(std::size_t n)
  {
    // Get current stream positions as offsets.
    std::size_t gnext = gptr() - &buffer_[0];
    std::size_t pnext = pptr() - &buffer_[0];
    std::size_t pend = epptr() - &buffer_[0];

    // Check if there is already enough space in the put area.
    if (n <= pend - pnext)
    {
      return;
    }

    // Shift existing contents of get area to start of buffer.
    if (gnext > 0)
    {
      pnext -= gnext;
      std::memmove(&buffer_[0], &buffer_[0] + gnext, pnext);
    }

    // Ensure buffer is large enough to hold at least the specified size.
    if (n > pend - pnext)
    {
      if (n <= max_size_ && pnext <= max_size_ - n)
      {
        pend = pnext + n;
        buffer_.resize((std::max<std::size_t>)(pend, 1));
      }
      else
      {
        std::length_error ex("asio::streambuf too long");
        asio::detail::throw_exception(ex);
      }
    }

    // Update stream positions.
    setg(&buffer_[0], &buffer_[0], &buffer_[0] + pnext);
    setp(&buffer_[0] + pnext, &buffer_[0] + pend);
  }